

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void ContextBlockSplitterStoredFinishBlockLiterals
               (ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  BlockSplit *pBVar4;
  size_t sVar5;
  ulong uVar6;
  void *p;
  long lVar7;
  uint *puVar8;
  HistogramLiteral *pHVar9;
  ulong uVar10;
  void *pvVar11;
  size_t sVar12;
  uint *puVar13;
  void *__src;
  uint32_t *puVar14;
  uint32_t *puVar15;
  HistogramLiteral *pHVar16;
  uint8_t uVar17;
  size_t sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pBVar4 = self->split_;
  sVar5 = self->num_contexts_;
  sVar18 = self->num_blocks_;
  pHVar9 = self->histograms_;
  if (sVar18 == 0) {
    self->num_blocks_ = 1;
    self->num_types_ = self->num_types_ + 1;
    uVar6 = self->curr_histogram_ix_ + sVar5;
    self->curr_histogram_ix_ = uVar6;
    if ((uVar6 < *self->histograms_size_) && (sVar5 != 0)) {
      pHVar9 = pHVar9 + uVar6;
      sVar18 = sVar5;
      do {
        memset(pHVar9,0,0x408);
        pHVar9->bit_cost_ = INFINITY;
        pHVar9 = pHVar9 + 1;
        sVar18 = sVar18 - 1;
      } while (sVar18 != 0);
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    uVar6 = (ulong)pBVar4->types[sVar18];
    if (pBVar4->num_types <= uVar6) {
      uVar6 = 0;
    }
    uVar10 = self->num_types_;
    uVar17 = (uint8_t)uVar6;
    if (uVar17 == (uint8_t)uVar10) {
      if (uVar10 < self->max_block_types_) {
        self->num_blocks_ = sVar18 + 1;
        self->num_types_ = uVar10 + 1;
        uVar6 = self->curr_histogram_ix_ + sVar5;
        self->curr_histogram_ix_ = uVar6;
        if ((uVar6 < *self->histograms_size_) && (sVar5 != 0)) {
          pHVar9 = pHVar9 + uVar6;
          sVar18 = sVar5;
          do {
            memset(pHVar9,0,0x408);
            pHVar9->bit_cost_ = INFINITY;
            pHVar9 = pHVar9 + 1;
            sVar18 = sVar18 - 1;
          } while (sVar18 != 0);
        }
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        goto LAB_0010dc85;
      }
      pBVar4->types[sVar18] = '\0';
      if (sVar5 == 0) {
        p = (void *)0x0;
      }
      else {
        p = BrotliAllocate(m,sVar5 * 0x410);
        sVar18 = 0;
        pvVar11 = p;
        pHVar16 = pHVar9;
        do {
          puVar13 = (uint *)(sVar18 * 0x410 + (long)p);
          memcpy(puVar13,pHVar9 + sVar18 + self->curr_histogram_ix_,0x410);
          plVar2 = (long *)((long)p + sVar18 * 0x410 + 0x400);
          *plVar2 = *plVar2 + pHVar9[sVar18].total_count_;
          lVar7 = 0;
          do {
            piVar1 = (int *)((long)pvVar11 + lVar7 * 4);
            *piVar1 = *piVar1 + pHVar16->data_[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x100);
          puVar8 = puVar13 + self->alphabet_size_;
          uVar6 = 0;
          if ((self->alphabet_size_ & 1) != 0) goto LAB_0010db5f;
          while (puVar13 < puVar8) {
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar6 = uVar6 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
LAB_0010db5f:
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar6 = uVar6 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
          }
          if (0xff < uVar6) {
            auVar20._8_4_ = (int)(uVar6 >> 0x20);
            auVar20._0_8_ = uVar6;
            auVar20._12_4_ = 0x45300000;
            log2((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          }
          sVar18 = sVar18 + 1;
          pHVar16 = pHVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 + 0x410);
          sVar12 = sVar5;
          __src = p;
        } while (sVar18 != sVar5);
        do {
          memcpy(pHVar9,__src,0x410);
          sVar18 = self->curr_histogram_ix_;
          memset(pHVar9 + sVar18,0,0x408);
          pHVar9[sVar18].bit_cost_ = INFINITY;
          pHVar9 = pHVar9 + 1;
          sVar12 = sVar12 - 1;
          __src = (void *)((long)__src + 0x410);
        } while (sVar12 != 0);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      pBVar4->num_types = self->num_types_;
    }
    else {
      if (sVar5 == 0) {
        pBVar4->types[self->num_blocks_] = uVar17;
        p = (void *)0x0;
      }
      else {
        p = BrotliAllocate(m,sVar5 * 0x410);
        puVar14 = (uint32_t *)((long)pHVar9->data_ + uVar6 * sVar5 * 0x410);
        sVar18 = 0;
        pvVar11 = p;
        puVar15 = puVar14;
        do {
          puVar13 = (uint *)((long)p + sVar18 * 0x410);
          memcpy(puVar13,pHVar9 + sVar18 + self->curr_histogram_ix_,0x410);
          plVar2 = (long *)((long)p + sVar18 * 0x410 + 0x400);
          *plVar2 = *plVar2 + *(long *)(puVar14 + sVar18 * 0x104 + 0x100);
          lVar7 = 0;
          do {
            piVar1 = (int *)((long)pvVar11 + lVar7 * 4);
            *piVar1 = *piVar1 + puVar15[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x100);
          puVar8 = puVar13 + self->alphabet_size_;
          uVar10 = 0;
          if ((self->alphabet_size_ & 1) != 0) goto LAB_0010d96c;
          while (puVar13 < puVar8) {
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar10 = uVar10 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
LAB_0010d96c:
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar10 = uVar10 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
          }
          if (0xff < uVar10) {
            auVar19._8_4_ = (int)(uVar10 >> 0x20);
            auVar19._0_8_ = uVar10;
            auVar19._12_4_ = 0x45300000;
            log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
          }
          sVar18 = sVar18 + 1;
          puVar15 = puVar15 + 0x104;
          pvVar11 = (void *)((long)pvVar11 + 0x410);
        } while (sVar18 != sVar5);
        pBVar4->types[self->num_blocks_] = uVar17;
        sVar18 = sVar5;
        pvVar11 = p;
        do {
          memcpy(pHVar9 + uVar6 * sVar5,pvVar11,0x410);
          sVar12 = self->curr_histogram_ix_;
          memset(pHVar9 + sVar12,0,0x408);
          pHVar9[sVar12].bit_cost_ = INFINITY;
          pvVar11 = (void *)((long)pvVar11 + 0x410);
          pHVar9 = pHVar9 + 1;
          sVar18 = sVar18 - 1;
        } while (sVar18 != 0);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
    }
    self->block_size_ = 0;
    self->merge_last_count_ = 0;
    BrotliFree(m,p);
  }
LAB_0010dc85:
  if (is_final != 0) {
    *self->histograms_size_ = sVar5 * pBVar4->num_types;
  }
  return;
}

Assistant:

static void ContextBlockSplitterStoredFinishBlockLiterals(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  HistogramLiteral* histograms = self->histograms_;
  if (self->num_blocks_ == 0) {
    /* Create a first block */
    ++self->num_blocks_;
    ++self->num_types_;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    uint8_t current_type = split->types[self->num_blocks_];
    if (current_type >= split->num_types) {
      current_type = 0;
    }

    if (current_type == (uint8_t)self->num_types_) {
      /* If max_block_types_ amount is reached merge with a block of type 0 */
      if (self->num_types_ >= self->max_block_types_) {
        current_type = 0;
        split->types[self->num_blocks_] = 0;
        /* Merge with the blocks of the same 0 block type */
        HistogramLiteral* combined_histo =
            BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
        double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
        size_t i;
        if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

        for (i = 0; i < num_contexts; ++i) {
          size_t curr_histo_ix = self->curr_histogram_ix_ + i;
          combined_histo[i] = histograms[curr_histo_ix];
          HistogramAddHistogramLiteral(&combined_histo[i],
              &histograms[current_type * num_contexts + i]);
          combined_entropy[i] = BitsEntropy(
              &combined_histo[i].data_[0], self->alphabet_size_);
        }

        for (i = 0; i < num_contexts; ++i) {
          histograms[current_type * num_contexts + i] =
              combined_histo[i];
          HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
        }
        ++self->num_blocks_;
        split->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BROTLI_FREE(m, combined_histo);
      } else {
        /* Create a new block type */
        ++self->num_blocks_;
        ++self->num_types_;
        self->curr_histogram_ix_ += num_contexts;
        if (self->curr_histogram_ix_ < *self->histograms_size_) {
          ClearHistogramsLiteral(
              &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
        }

        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
    } else {
      /* Merge with the blocks of the same current_type block type */
      HistogramLiteral* combined_histo =
          BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
      double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
      size_t i;
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

      for (i = 0; i < num_contexts; ++i) {
        size_t curr_histo_ix = self->curr_histogram_ix_ + i;
        combined_histo[i] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[i],
            &histograms[current_type * num_contexts + i]);
        combined_entropy[i] = BitsEntropy(
            &combined_histo[i].data_[0], self->alphabet_size_);
      }
      split->types[self->num_blocks_] = current_type;
      for (i = 0; i < num_contexts; ++i) {
        histograms[current_type * num_contexts + i] =
            combined_histo[i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BROTLI_FREE(m, combined_histo);
    }
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
  }
}